

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O0

_Bool set_current_path(void)

{
  _Bool _Var1;
  undefined8 in_RAX;
  bool bVar2;
  _Bool res;
  char *unaff_retaddr;
  char *str;
  
  _Var1 = get_current_path(unaff_retaddr);
  str = (char *)CONCAT17((char)((ulong)in_RAX >> 0x38),CONCAT16(_Var1,(int6)in_RAX));
  if ((g_verbose & 1U) != 0) {
    console_message_string(unaff_retaddr,str);
  }
  bVar2 = ((ulong)str & 0x1000000000000) == 0;
  if (bVar2) {
    clear_path_string(unaff_retaddr,(size_t)str);
  }
  return !bVar2;
}

Assistant:

bool set_current_path()
{
	bool res = get_current_path(g_current_path);
	if (g_verbose)
	{
		console_message_string(u8"Current Path: %s\n", g_current_path);
	}
	if (res)
	{
		return true;
	}
	clear_path_string(g_current_path, MAX_PATH);
	return false;
}